

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::ShowRef::Deserialize(ShowRef *this,Deserializer *deserializer)

{
  ShowRef *this_00;
  pointer pSVar1;
  _Head_base<0UL,_duckdb::ShowRef_*,_false> local_20;
  
  this_00 = (ShowRef *)operator_new(0x98);
  ShowRef(this_00);
  local_20._M_head_impl = this_00;
  pSVar1 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,200,"table_name",&pSVar1->table_name);
  pSVar1 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
            (deserializer,0xc9,"query",&pSVar1->query);
  pSVar1 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_20);
  Deserializer::ReadProperty<duckdb::ShowType>(deserializer,0xca,"show_type",&pSVar1->show_type);
  (this->super_TableRef)._vptr_TableRef = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> ShowRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ShowRef>(new ShowRef());
	deserializer.ReadPropertyWithDefault<string>(200, "table_name", result->table_name);
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(201, "query", result->query);
	deserializer.ReadProperty<ShowType>(202, "show_type", result->show_type);
	return std::move(result);
}